

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QCalendarWidget::updateCell(QCalendarWidget *this,QDate date)

{
  bool bVar1;
  QCalendarWidgetPrivate *this_00;
  QWidget *rect;
  undefined8 in_RSI;
  int *in_RDI;
  long in_FS_OFFSET;
  QCalendarWidgetPrivate *d;
  QModelIndex modelIndex;
  int column;
  int row;
  char *in_stack_ffffffffffffff48;
  QModelIndex *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  QCalendarModel *this_01;
  undefined4 in_stack_ffffffffffffff60;
  int iVar2;
  undefined4 in_stack_ffffffffffffff64;
  int iVar3;
  undefined1 local_70 [8];
  QDate in_stack_ffffffffffffff98;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined8 local_40;
  int local_38;
  int local_34;
  char local_30 [32];
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  bVar1 = QDate::isValid((QDate *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    bVar1 = QWidget::isVisible((QWidget *)0x520cb7);
    if (bVar1) {
      this_00 = d_func((QCalendarWidget *)0x520cca);
      local_34 = -0x55555556;
      local_38 = -0x55555556;
      local_40 = local_10;
      QtPrivate::QCalendarModel::cellForDate
                ((QCalendarModel *)this_00,in_stack_ffffffffffffff98,in_RDI,
                 (int *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      if ((local_34 != -1) && (local_38 != -1)) {
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        local_50 = &DAT_aaaaaaaaaaaaaaaa;
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        this_01 = this_00->m_model;
        iVar2 = local_34;
        iVar3 = local_38;
        QModelIndex::QModelIndex((QModelIndex *)0x520d86);
        (**(code **)(*(long *)this_01 + 0x60))(&local_58,this_01,iVar2,iVar3,local_70);
        bVar1 = QModelIndex::isValid(in_stack_ffffffffffffff50);
        if (bVar1) {
          rect = QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff50);
          (**(code **)(*(long *)&(this_00->m_view->super_QTableView).super_QAbstractItemView.
                                 super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1e0))
                    (this_00->m_view,&local_58);
          QWidget::update((QWidget *)this_01,(QRect *)rect);
        }
      }
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
               in_stack_ffffffffffffff48);
    QMessageLogger::warning(local_30,"QCalendarWidget::updateCell: Invalid date");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCalendarWidget::updateCell(QDate date)
{
    if (Q_UNLIKELY(!date.isValid())) {
        qWarning("QCalendarWidget::updateCell: Invalid date");
        return;
    }

    if (!isVisible())
        return;

    Q_D(QCalendarWidget);
    int row, column;
    d->m_model->cellForDate(date, &row, &column);
    if (row == -1 || column == -1)
        return;

    QModelIndex modelIndex = d->m_model->index(row, column);
    if (!modelIndex.isValid())
        return;

    d->m_view->viewport()->update(d->m_view->visualRect(modelIndex));
}